

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

void NgramBuilder_free(NgramBuilder *builder_)

{
  NgramBuilder voc_;
  
  if ((builder_ != (NgramBuilder *)0x0) && (voc_ = *builder_, voc_ != (NgramBuilder)0x0)) {
    HashVocab_free(&voc_->vocab);
    free(voc_->ngram_cache);
    free(voc_->ngram_offsets);
    free(voc_->gram_nums);
    free(voc_->added_gram_nums);
    free(voc_);
    *builder_ = (NgramBuilder)0x0;
    return;
  }
  __assert_fail("builder_ && *builder_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                700,"void NgramBuilder_free(NgramBuilder *)");
}

Assistant:

void NgramBuilder_free(NgramBuilder* builder_){
    assert(builder_ && *builder_);
    NgramBuilder builder = *builder_;
    HashVocab_free(&builder->vocab);
    free(builder->ngram_cache);
    free(builder->ngram_offsets);
    free(builder->gram_nums);
    free(builder->added_gram_nums);
    free(builder);
    *builder_ = NULL;
}